

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O1

void testrand256(uchar *b32)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  lVar3 = 0;
  do {
    lVar4 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
            secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar5 = secp256k1_test_state[1] << 0x11;
    uVar2 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar1 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar2;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar1;
    secp256k1_test_state[3] = uVar1 << 0x2d | uVar1 >> 0x13;
    secp256k1_test_state[2] = uVar2 ^ uVar5;
    *(long *)(b32 + lVar3 * 8) = lVar4;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  return;
}

Assistant:

static void testrand256(unsigned char *b32) {
    int i;
    for (i = 0; i < 4; ++i) {
        uint64_t val = testrand64();
        b32[0] = val;
        b32[1] = val >> 8;
        b32[2] = val >> 16;
        b32[3] = val >> 24;
        b32[4] = val >> 32;
        b32[5] = val >> 40;
        b32[6] = val >> 48;
        b32[7] = val >> 56;
        b32 += 8;
    }
}